

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O0

void ANMS(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
         vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners)

{
  bool bVar1;
  reference pKVar2;
  ulong uVar3;
  reference pvVar4;
  reference p1;
  size_type sVar5;
  iterator __first;
  iterator __last;
  float _response;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_190;
  const_iterator local_188;
  KeyPoint *local_180;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_178;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_170;
  KeyPoint *local_168;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_160;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_158;
  const_iterator local_150;
  KeyPoint *local_148;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_140;
  Point_<float> local_138;
  KeyPoint local_130;
  float local_114;
  float local_110;
  float dist;
  float resP;
  int i;
  float minDist;
  KeyPoint local_fc;
  float local_e0;
  undefined1 local_dc [4];
  float response_1;
  KeyPoint point_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range1_1;
  float local_a0;
  float response;
  undefined1 local_8c [8];
  KeyPoint point;
  iterator __end1;
  iterator __begin1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range1;
  undefined1 local_50 [4];
  float globalMax;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> r;
  vector<float,_std::allocator<float>_> robustResponse;
  float robustC;
  int n;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint_local;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
  __range1._4_4_ = 0.0;
  __end1 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin(keyPoint);
  point._20_8_ = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end(keyPoint);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                                     *)&point.octave), bVar1) {
    pKVar2 = __gnu_cxx::
             __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
             ::operator*(&__end1);
    cv::KeyPoint::KeyPoint((KeyPoint *)local_8c,pKVar2);
    local_a0 = point.size;
    __range1_1._4_4_ = point.size * 0.9;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               &r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict *)((long)&__range1_1 + 4));
    if (__range1._4_4_ < local_a0) {
      __range1._4_4_ = local_a0;
    }
    __gnu_cxx::
    __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin(keyPoint);
  point_1._20_8_ = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end(keyPoint);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                             *)&point_1.octave), bVar1) {
    pKVar2 = __gnu_cxx::
             __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
             ::operator*(&__end1_1);
    cv::KeyPoint::KeyPoint((KeyPoint *)local_dc,pKVar2);
    local_e0 = point_1.size;
    if (point_1.size <= __range1._4_4_ * 0.9) {
      resP = std::numeric_limits<float>::max();
      for (dist = 0.0; uVar3 = (ulong)(int)dist,
          sVar5 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::size(keyPoint),
          uVar3 < sVar5; dist = (float)((int)dist + 1)) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)
                            &r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)dist);
        local_110 = *pvVar4;
        if (local_e0 < local_110) {
          p1 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::operator[]
                         (keyPoint,(long)(int)dist);
          local_114 = getDistance(p1,(KeyPoint *)local_dc);
          if (local_114 < resP) {
            resP = local_114;
          }
        }
      }
      cv::Point_<float>::Point_(&local_138,(Point_<float> *)local_dc);
      cv::KeyPoint::KeyPoint(&local_130,&local_138,3.0,-1.0,resP,0,-1);
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50,&local_130);
    }
    else {
      cv::Point_<float>::Point_((Point_<float> *)&i,(Point_<float> *)local_dc);
      _response = std::numeric_limits<float>::max();
      cv::KeyPoint::KeyPoint(&local_fc,(Point2f *)&i,3.0,-1.0,_response,0,-1);
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50,&local_fc);
    }
    __gnu_cxx::
    __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>::
    operator++(&__end1_1);
  }
  local_140._M_current =
       (KeyPoint *)
       std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                 ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
  local_148 = (KeyPoint *)
              std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end
                        ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
  std::
  sort<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>
            (local_140,
             (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
              )local_148,compDist);
  sVar5 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::size
                    ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
  if (sVar5 < 0x1f5) {
    local_190._M_current =
         (KeyPoint *)std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin(corners);
    __gnu_cxx::
    __normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>::
    __normal_iterator<cv::KeyPoint*>
              ((__normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>
                *)&local_188,&local_190);
    __first = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                        ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
    __last = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end
                       ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,void>
              ((vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners,local_188,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )__first._M_current,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )__last._M_current);
  }
  else {
    local_158._M_current =
         (KeyPoint *)std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin(corners);
    __gnu_cxx::
    __normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>::
    __normal_iterator<cv::KeyPoint*>
              ((__normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>
                *)&local_150,&local_158);
    local_160._M_current =
         (KeyPoint *)
         std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                   ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
    local_178._M_current =
         (KeyPoint *)
         std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                   ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
    local_170 = __gnu_cxx::
                __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                ::operator+(&local_178,500);
    local_168 = (KeyPoint *)
                __gnu_cxx::
                __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                ::operator-(&local_170,1);
    local_180 = (KeyPoint *)
                std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
                insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,void>
                          ((vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners,local_150,
                           local_160,
                           (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                            )local_168);
  }
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_50);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ANMS(std::vector<KeyPoint>& keyPoint, std::vector<KeyPoint>& corners) {
	const int n = 500;
	const float robustC = 0.9F;

	vector<float> robustResponse;
	vector<KeyPoint> r;


	float globalMax = 0.0F;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		robustResponse.push_back(response*robustC);
		if (response > globalMax) {
			globalMax = response;
		}
	}

	globalMax *= robustC;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		if (response > globalMax) {
			r.push_back(KeyPoint(point.pt, 3, -1.0F, numeric_limits<float>::max()));
		}
		else {
			float minDist = numeric_limits<float>::max();
			for (int i = 0; i < keyPoint.size(); ++i) {
				float resP = robustResponse[i];
				if (resP > response) {
					float dist = getDistance(keyPoint[i], point);
					if (dist < minDist) {
						minDist = dist;
					}
				}
			}
			r.push_back(KeyPoint(point.pt, 3, -1.0F, minDist));
		}
	}

	sort(r.begin(), r.end(), compDist);
	if (r.size() > n) {
		corners.insert(corners.begin(), r.begin(), r.begin() + n - 1);
	}
	else {
		corners.insert(corners.begin(), r.begin(), r.end());
	}

}